

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QHash<int,_QVariant> __thiscall
QList<QHash<int,_QVariant>_>::value(QList<QHash<int,_QVariant>_> *this,qsizetype i)

{
  QList<QHash<int,_QVariant>_> *in_RDX;
  Data *in_RDI;
  long in_FS_OFFSET;
  QHash<int,_QVariant> *this_00;
  QList<QHash<int,_QVariant>_> *this_01;
  QHash<int,_QVariant> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (Data *)0x0;
  this_00 = &local_10;
  this_01 = in_RDX;
  QHash<int,_QVariant>::QHash(this_00);
  value(this_01,(qsizetype)this_00,(parameter_type)in_RDX);
  QHash<int,_QVariant>::~QHash((QHash<int,_QVariant> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QHash<int,_QVariant>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(qsizetype i) const { return value(i, T()); }